

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* spirv_cross::CompilerMSL::get_illegal_func_names_abi_cxx11_(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  string *local_17d8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1012;
  key_equal local_1011;
  hasher local_1010;
  undefined1 local_100f;
  allocator local_100e;
  allocator local_100d;
  allocator local_100c;
  allocator local_100b;
  allocator local_100a;
  allocator local_1009;
  allocator local_1008;
  allocator local_1007;
  allocator local_1006;
  allocator local_1005;
  allocator local_1004;
  allocator local_1003;
  allocator local_1002;
  allocator local_1001;
  allocator local_1000;
  allocator local_fff;
  allocator local_ffe;
  allocator local_ffd;
  allocator local_ffc;
  allocator local_ffb;
  allocator local_ffa;
  allocator local_ff9;
  allocator local_ff8;
  allocator local_ff7;
  allocator local_ff6;
  allocator local_ff5;
  allocator local_ff4;
  allocator local_ff3;
  allocator local_ff2;
  allocator local_ff1;
  allocator local_ff0;
  allocator local_fef;
  allocator local_fee;
  allocator local_fed;
  allocator local_fec;
  allocator local_feb;
  allocator local_fea;
  allocator local_fe9;
  allocator local_fe8;
  allocator local_fe7;
  allocator local_fe6;
  allocator local_fe5;
  allocator local_fe4;
  allocator local_fe3;
  allocator local_fe2;
  allocator local_fe1;
  allocator local_fe0;
  allocator local_fdf;
  allocator local_fde;
  allocator local_fdd;
  allocator local_fdc;
  allocator local_fdb;
  allocator local_fda;
  allocator local_fd9;
  allocator local_fd8;
  allocator local_fd7;
  allocator local_fd6;
  allocator local_fd5;
  allocator local_fd4;
  allocator local_fd3;
  allocator local_fd2;
  allocator local_fd1;
  allocator local_fd0;
  allocator local_fcf;
  allocator local_fce;
  allocator local_fcd;
  allocator local_fcc;
  allocator local_fcb;
  allocator local_fca;
  allocator local_fc9;
  allocator local_fc8;
  allocator local_fc7;
  allocator local_fc6;
  allocator local_fc5;
  allocator local_fc4;
  allocator local_fc3;
  allocator local_fc2;
  allocator local_fc1;
  allocator local_fc0;
  allocator local_fbf;
  allocator local_fbe;
  allocator local_fbd;
  allocator local_fbc;
  allocator local_fbb;
  allocator local_fba;
  allocator local_fb9;
  allocator local_fb8;
  allocator local_fb7;
  allocator local_fb6;
  allocator local_fb5;
  allocator local_fb4;
  allocator local_fb3;
  allocator local_fb2;
  allocator local_fb1;
  allocator local_fb0;
  allocator local_faf;
  allocator local_fae;
  allocator local_fad;
  allocator local_fac;
  allocator local_fab;
  allocator local_faa;
  allocator local_fa9;
  allocator local_fa8;
  allocator local_fa7;
  allocator local_fa6;
  allocator local_fa5;
  allocator local_fa4;
  allocator local_fa3;
  allocator local_fa2;
  allocator local_fa1;
  allocator local_fa0;
  allocator local_f9f;
  allocator local_f9e;
  allocator local_f9d;
  allocator local_f9c;
  allocator local_f9b;
  allocator local_f9a;
  allocator local_f99;
  allocator local_f98;
  allocator local_f97;
  allocator local_f96;
  allocator local_f95 [20];
  allocator local_f81;
  string *local_f80;
  string local_f78 [32];
  string local_f58 [32];
  string local_f38 [32];
  string local_f18 [32];
  string local_ef8 [32];
  string local_ed8 [32];
  string local_eb8 [32];
  string local_e98 [32];
  string local_e78 [32];
  string local_e58 [32];
  string local_e38 [32];
  string local_e18 [32];
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [32];
  string local_d98 [32];
  string local_d78 [32];
  string local_d58 [32];
  string local_d38 [32];
  string local_d18 [32];
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  string local_b78 [32];
  string local_b58 [32];
  string local_b38 [32];
  string local_b18 [32];
  string local_af8 [32];
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  iterator local_18;
  size_type local_10;
  
  if (get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      local_100f = 1;
      local_f80 = local_f78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f78,"main",&local_f81);
      local_f80 = local_f58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f58,"saturate",local_f95);
      local_f80 = local_f38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f38,"assert",&local_f96);
      local_f80 = local_f18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f18,"fmin3",&local_f97);
      local_f80 = local_ef8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ef8,"fmax3",&local_f98);
      local_f80 = local_ed8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ed8,"VARIABLE_TRACEPOINT",&local_f99);
      local_f80 = local_eb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_eb8,"STATIC_DATA_TRACEPOINT",&local_f9a);
      local_f80 = local_e98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e98,"STATIC_DATA_TRACEPOINT_V",&local_f9b);
      local_f80 = local_e78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e78,"METAL_ALIGN",&local_f9c);
      local_f80 = local_e58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e58,"METAL_ASM",&local_f9d);
      local_f80 = local_e38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e38,"METAL_CONST",&local_f9e);
      local_f80 = local_e18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e18,"METAL_DEPRECATED",&local_f9f);
      local_f80 = local_df8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_df8,"METAL_ENABLE_IF",&local_fa0);
      local_f80 = local_dd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_dd8,"METAL_FUNC",&local_fa1);
      local_f80 = local_db8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_db8,"METAL_INTERNAL",&local_fa2);
      local_f80 = local_d98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d98,"METAL_NON_NULL_RETURN",&local_fa3);
      local_f80 = local_d78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d78,"METAL_NORETURN",&local_fa4);
      local_f80 = local_d58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d58,"METAL_NOTHROW",&local_fa5);
      local_f80 = local_d38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d38,"METAL_PURE",&local_fa6);
      local_f80 = local_d18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d18,"METAL_UNAVAILABLE",&local_fa7);
      local_f80 = local_cf8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cf8,"METAL_IMPLICIT",&local_fa8);
      local_f80 = local_cd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cd8,"METAL_EXPLICIT",&local_fa9);
      local_f80 = local_cb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_cb8,"METAL_CONST_ARG",&local_faa);
      local_f80 = local_c98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c98,"METAL_ARG_UNIFORM",&local_fab);
      local_f80 = local_c78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c78,"METAL_ZERO_ARG",&local_fac);
      local_f80 = local_c58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c58,"METAL_VALID_LOD_ARG",&local_fad);
      local_f80 = local_c38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c38,"METAL_VALID_LEVEL_ARG",&local_fae);
      local_f80 = local_c18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c18,"METAL_VALID_STORE_ORDER",&local_faf);
      local_f80 = local_bf8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_bf8,"METAL_VALID_LOAD_ORDER",&local_fb0);
      local_f80 = local_bd8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_bd8,"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",&local_fb1);
      local_f80 = local_bb8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_bb8,"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",&local_fb2);
      local_f80 = local_b98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b98,"METAL_VALID_RENDER_TARGET",&local_fb3);
      local_f80 = local_b78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b78,"is_function_constant_defined",&local_fb4);
      local_f80 = local_b58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b58,"CHAR_BIT",&local_fb5);
      local_f80 = local_b38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b38,"SCHAR_MAX",&local_fb6);
      local_f80 = local_b18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b18,"SCHAR_MIN",&local_fb7);
      local_f80 = local_af8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_af8,"UCHAR_MAX",&local_fb8);
      local_f80 = local_ad8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ad8,"CHAR_MAX",&local_fb9);
      local_f80 = local_ab8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_ab8,"CHAR_MIN",&local_fba);
      local_f80 = local_a98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a98,"USHRT_MAX",&local_fbb);
      local_f80 = local_a78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a78,"SHRT_MAX",&local_fbc);
      local_f80 = local_a58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a58,"SHRT_MIN",&local_fbd);
      local_f80 = local_a38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a38,"UINT_MAX",&local_fbe);
      local_f80 = local_a18;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a18,"INT_MAX",&local_fbf);
      local_f80 = local_9f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9f8,"INT_MIN",&local_fc0);
      local_f80 = local_9d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9d8,"FLT_DIG",&local_fc1);
      local_f80 = local_9b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_9b8,"FLT_MANT_DIG",&local_fc2);
      local_f80 = local_998;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_998,"FLT_MAX_10_EXP",&local_fc3);
      local_f80 = local_978;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_978,"FLT_MAX_EXP",&local_fc4);
      local_f80 = local_958;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_958,"FLT_MIN_10_EXP",&local_fc5);
      local_f80 = local_938;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_938,"FLT_MIN_EXP",&local_fc6);
      local_f80 = local_918;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_918,"FLT_RADIX",&local_fc7);
      local_f80 = local_8f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8f8,"FLT_MAX",&local_fc8);
      local_f80 = local_8d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8d8,"FLT_MIN",&local_fc9);
      local_f80 = local_8b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_8b8,"FLT_EPSILON",&local_fca);
      local_f80 = local_898;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_898,"FP_ILOGB0",&local_fcb);
      local_f80 = local_878;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_878,"FP_ILOGBNAN",&local_fcc);
      local_f80 = local_858;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_858,"MAXFLOAT",&local_fcd);
      local_f80 = local_838;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_838,"HUGE_VALF",&local_fce);
      local_f80 = local_818;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_818,"INFINITY",&local_fcf);
      local_f80 = local_7f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7f8,"NAN",&local_fd0);
      local_f80 = local_7d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7d8,"M_E_F",&local_fd1);
      local_f80 = local_7b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_7b8,"M_LOG2E_F",&local_fd2);
      local_f80 = local_798;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_798,"M_LOG10E_F",&local_fd3);
      local_f80 = local_778;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_778,"M_LN2_F",&local_fd4);
      local_f80 = local_758;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_758,"M_LN10_F",&local_fd5);
      local_f80 = local_738;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_738,"M_PI_F",&local_fd6);
      local_f80 = local_718;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_718,"M_PI_2_F",&local_fd7);
      local_f80 = local_6f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6f8,"M_PI_4_F",&local_fd8);
      local_f80 = local_6d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6d8,"M_1_PI_F",&local_fd9);
      local_f80 = local_6b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_6b8,"M_2_PI_F",&local_fda);
      local_f80 = local_698;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_698,"M_2_SQRTPI_F",&local_fdb);
      local_f80 = local_678;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_678,"M_SQRT2_F",&local_fdc);
      local_f80 = local_658;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_658,"M_SQRT1_2_F",&local_fdd);
      local_f80 = local_638;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_638,"HALF_DIG",&local_fde);
      local_f80 = local_618;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_618,"HALF_MANT_DIG",&local_fdf);
      local_f80 = local_5f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5f8,"HALF_MAX_10_EXP",&local_fe0);
      local_f80 = local_5d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5d8,"HALF_MAX_EXP",&local_fe1);
      local_f80 = local_5b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_5b8,"HALF_MIN_10_EXP",&local_fe2);
      local_f80 = local_598;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_598,"HALF_MIN_EXP",&local_fe3);
      local_f80 = local_578;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_578,"HALF_RADIX",&local_fe4);
      local_f80 = local_558;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_558,"HALF_MAX",&local_fe5);
      local_f80 = local_538;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_538,"HALF_MIN",&local_fe6);
      local_f80 = local_518;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_518,"HALF_EPSILON",&local_fe7);
      local_f80 = local_4f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4f8,"MAXHALF",&local_fe8);
      local_f80 = local_4d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4d8,"HUGE_VALH",&local_fe9);
      local_f80 = local_4b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_4b8,"M_E_H",&local_fea);
      local_f80 = local_498;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_498,"M_LOG2E_H",&local_feb);
      local_f80 = local_478;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_478,"M_LOG10E_H",&local_fec);
      local_f80 = local_458;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_458,"M_LN2_H",&local_fed);
      local_f80 = local_438;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_438,"M_LN10_H",&local_fee);
      local_f80 = local_418;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_418,"M_PI_H",&local_fef);
      local_f80 = local_3f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3f8,"M_PI_2_H",&local_ff0);
      local_f80 = local_3d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3d8,"M_PI_4_H",&local_ff1);
      local_f80 = local_3b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_3b8,"M_1_PI_H",&local_ff2);
      local_f80 = local_398;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_398,"M_2_PI_H",&local_ff3);
      local_f80 = local_378;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_378,"M_2_SQRTPI_H",&local_ff4);
      local_f80 = local_358;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_358,"M_SQRT2_H",&local_ff5);
      local_f80 = local_338;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_338,"M_SQRT1_2_H",&local_ff6);
      local_f80 = local_318;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_318,"DBL_DIG",&local_ff7);
      local_f80 = local_2f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2f8,"DBL_MANT_DIG",&local_ff8);
      local_f80 = local_2d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2d8,"DBL_MAX_10_EXP",&local_ff9);
      local_f80 = local_2b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2b8,"DBL_MAX_EXP",&local_ffa);
      local_f80 = local_298;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_298,"DBL_MIN_10_EXP",&local_ffb);
      local_f80 = local_278;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_278,"DBL_MIN_EXP",&local_ffc);
      local_f80 = local_258;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_258,"DBL_RADIX",&local_ffd);
      local_f80 = local_238;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_238,"DBL_MAX",&local_ffe);
      local_f80 = local_218;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_218,"DBL_MIN",&local_fff);
      local_f80 = local_1f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1f8,"DBL_EPSILON",&local_1000);
      local_f80 = local_1d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1d8,"HUGE_VAL",&local_1001);
      local_f80 = local_1b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1b8,"M_E",&local_1002);
      local_f80 = local_198;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_198,"M_LOG2E",&local_1003);
      local_f80 = local_178;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_178,"M_LOG10E",&local_1004);
      local_f80 = local_158;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_158,"M_LN2",&local_1005);
      local_f80 = local_138;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_138,"M_LN10",&local_1006);
      local_f80 = local_118;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_118,"M_PI",&local_1007);
      local_f80 = local_f8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_f8,"M_PI_2",&local_1008);
      local_f80 = local_d8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_d8,"M_PI_4",&local_1009);
      local_f80 = local_b8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_b8,"M_1_PI",&local_100a);
      local_f80 = local_98;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_98,"M_2_PI",&local_100b);
      local_f80 = local_78;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_78,"M_2_SQRTPI",&local_100c);
      local_f80 = local_58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_58,"M_SQRT2",&local_100d);
      local_f80 = local_38;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_38,"M_SQRT1_2",&local_100e);
      local_100f = 0;
      local_18 = (iterator)local_f78;
      local_10 = 0x7b;
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_1012);
      __l._M_len = local_10;
      __l._M_array = local_18;
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,__l,0,
                      &local_1010,&local_1011,&local_1012);
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_1012);
      local_17d8 = (string *)&local_18;
      do {
        local_17d8 = local_17d8 + -0x20;
        ::std::__cxx11::string::~string(local_17d8);
      } while (local_17d8 != local_f78);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1009);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1008);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1007);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1006);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1005);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1004);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1003);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1002);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1001);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1000);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fff);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ffe);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ffd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ffc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ffb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ffa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fef);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fee);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fed);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fec);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_feb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fea);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fdf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fde);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fdd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fdc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fdb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fda);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fcf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fce);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fcd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fcc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fcb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fca);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fbf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fbe);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fbd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fbc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fbb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fba);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_faf);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fae);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fad);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fac);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fab);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_faa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa7);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa6);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa4);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa3);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9f);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9e);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9d);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9c);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9b);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f99);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f98);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f97);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f96);
      ::std::allocator<char>::~allocator((allocator<char> *)local_f95);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f81);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_);
    }
  }
  return &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_;
}

Assistant:

const std::unordered_set<std::string> &CompilerMSL::get_illegal_func_names()
{
	static const unordered_set<string> illegal_func_names = {
		"main",
		"saturate",
		"assert",
		"fmin3",
		"fmax3",
		"VARIABLE_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT_V",
		"METAL_ALIGN",
		"METAL_ASM",
		"METAL_CONST",
		"METAL_DEPRECATED",
		"METAL_ENABLE_IF",
		"METAL_FUNC",
		"METAL_INTERNAL",
		"METAL_NON_NULL_RETURN",
		"METAL_NORETURN",
		"METAL_NOTHROW",
		"METAL_PURE",
		"METAL_UNAVAILABLE",
		"METAL_IMPLICIT",
		"METAL_EXPLICIT",
		"METAL_CONST_ARG",
		"METAL_ARG_UNIFORM",
		"METAL_ZERO_ARG",
		"METAL_VALID_LOD_ARG",
		"METAL_VALID_LEVEL_ARG",
		"METAL_VALID_STORE_ORDER",
		"METAL_VALID_LOAD_ORDER",
		"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",
		"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",
		"METAL_VALID_RENDER_TARGET",
		"is_function_constant_defined",
		"CHAR_BIT",
		"SCHAR_MAX",
		"SCHAR_MIN",
		"UCHAR_MAX",
		"CHAR_MAX",
		"CHAR_MIN",
		"USHRT_MAX",
		"SHRT_MAX",
		"SHRT_MIN",
		"UINT_MAX",
		"INT_MAX",
		"INT_MIN",
		"FLT_DIG",
		"FLT_MANT_DIG",
		"FLT_MAX_10_EXP",
		"FLT_MAX_EXP",
		"FLT_MIN_10_EXP",
		"FLT_MIN_EXP",
		"FLT_RADIX",
		"FLT_MAX",
		"FLT_MIN",
		"FLT_EPSILON",
		"FP_ILOGB0",
		"FP_ILOGBNAN",
		"MAXFLOAT",
		"HUGE_VALF",
		"INFINITY",
		"NAN",
		"M_E_F",
		"M_LOG2E_F",
		"M_LOG10E_F",
		"M_LN2_F",
		"M_LN10_F",
		"M_PI_F",
		"M_PI_2_F",
		"M_PI_4_F",
		"M_1_PI_F",
		"M_2_PI_F",
		"M_2_SQRTPI_F",
		"M_SQRT2_F",
		"M_SQRT1_2_F",
		"HALF_DIG",
		"HALF_MANT_DIG",
		"HALF_MAX_10_EXP",
		"HALF_MAX_EXP",
		"HALF_MIN_10_EXP",
		"HALF_MIN_EXP",
		"HALF_RADIX",
		"HALF_MAX",
		"HALF_MIN",
		"HALF_EPSILON",
		"MAXHALF",
		"HUGE_VALH",
		"M_E_H",
		"M_LOG2E_H",
		"M_LOG10E_H",
		"M_LN2_H",
		"M_LN10_H",
		"M_PI_H",
		"M_PI_2_H",
		"M_PI_4_H",
		"M_1_PI_H",
		"M_2_PI_H",
		"M_2_SQRTPI_H",
		"M_SQRT2_H",
		"M_SQRT1_2_H",
		"DBL_DIG",
		"DBL_MANT_DIG",
		"DBL_MAX_10_EXP",
		"DBL_MAX_EXP",
		"DBL_MIN_10_EXP",
		"DBL_MIN_EXP",
		"DBL_RADIX",
		"DBL_MAX",
		"DBL_MIN",
		"DBL_EPSILON",
		"HUGE_VAL",
		"M_E",
		"M_LOG2E",
		"M_LOG10E",
		"M_LN2",
		"M_LN10",
		"M_PI",
		"M_PI_2",
		"M_PI_4",
		"M_1_PI",
		"M_2_PI",
		"M_2_SQRTPI",
		"M_SQRT2",
		"M_SQRT1_2",
	};

	return illegal_func_names;
}